

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::UdpBodySyntax::UdpBodySyntax
          (UdpBodySyntax *this,SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *portDecls,
          UdpInitialStmtSyntax *initialStmt,Token table,
          SyntaxList<slang::syntax::UdpEntrySyntax> *entries,Token endtable)

{
  undefined4 uVar1;
  bool bVar2;
  reference ppUVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  UdpEntrySyntax *child_1;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::UdpEntrySyntax> *__range2_1;
  UdpPortDeclSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *in_stack_ffffffffffffff68;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *this_00;
  __normal_iterator<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
  local_70;
  SyntaxNode **local_68;
  UdpPortDeclSyntax *local_60;
  iterator local_58;
  iterator local_48;
  SyntaxNode *local_38;
  SyntaxNode *local_28;
  SyntaxNode *local_10;
  undefined8 local_8;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)&stack0x00000008;
  local_28 = in_RDX;
  local_10 = in_RCX;
  local_8 = in_R8;
  SyntaxNode::SyntaxNode(in_RDI,UdpBody);
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::SeparatedSyntaxList
            (this_00,in_stack_ffffffffffffff68);
  in_RDI[3].parent = local_28;
  in_RDI[3].previewNode = local_10;
  *(undefined8 *)(in_RDI + 4) = local_8;
  SyntaxList<slang::syntax::UdpEntrySyntax>::SyntaxList
            ((SyntaxList<slang::syntax::UdpEntrySyntax> *)this_00,
             (SyntaxList<slang::syntax::UdpEntrySyntax> *)in_stack_ffffffffffffff68);
  in_RDI[6].previewNode = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[7].kind = (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[7].field_0x4 = uVar1;
  in_RDI[1].previewNode = in_RDI;
  local_38 = in_RDI + 1;
  local_48 = SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)0x526c4f);
  local_58 = SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::end(this_00);
  while( true ) {
    bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::UdpPortDeclSyntax_*> *)
                       in_stack_ffffffffffffff68);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_60 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
               ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
                            *)0x526c8e);
    (local_60->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
                *)this_00);
  }
  if (in_RDI[3].parent != (SyntaxNode *)0x0) {
    (in_RDI[3].parent)->parent = in_RDI;
  }
  *(SyntaxNode **)(in_RDI + 5) = in_RDI;
  local_68 = &in_RDI[4].parent;
  local_70._M_current =
       (UdpEntrySyntax **)
       std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff68);
  std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL> *)in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff68);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppUVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_70);
    ((*ppUVar3)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::UdpEntrySyntax_**,_std::span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_70);
  }
  return;
}

Assistant:

UdpBodySyntax(const SeparatedSyntaxList<UdpPortDeclSyntax>& portDecls, UdpInitialStmtSyntax* initialStmt, Token table, const SyntaxList<UdpEntrySyntax>& entries, Token endtable) :
        SyntaxNode(SyntaxKind::UdpBody), portDecls(portDecls), initialStmt(initialStmt), table(table), entries(entries), endtable(endtable) {
        this->portDecls.parent = this;
        for (auto child : this->portDecls)
            child->parent = this;
        if (this->initialStmt) this->initialStmt->parent = this;
        this->entries.parent = this;
        for (auto child : this->entries)
            child->parent = this;
    }